

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void store(item *x,item *y)

{
  uint uVar1;
  int op;
  int iVar2;
  typeDesc *ptVar3;
  typeDesc *ptVar4;
  int c;
  int b;
  char *msg;
  
  ptVar3 = getType(x->typeIndex);
  ptVar4 = getType(y->typeIndex);
  uVar1 = ptVar3->form - 800;
  if (((5 < uVar1) || ((0x33U >> (uVar1 & 0x1f) & 1) == 0)) || (ptVar3->form != ptVar4->form)) {
    msg = "incompatible assignment";
LAB_001077a3:
    mark(msg);
    exit(-1);
  }
  iVar2 = y->mode;
  if ((iVar2 != 0x2c0) && (iVar2 != 0x2c2)) {
    if (iVar2 == 0x2c3) {
      iVar2 = selectOpNegated(y->c);
      put(iVar2,y->r,0,y->a);
      regs[y->r] = 0;
      y->a = pc + -1;
      fixLink(y->b);
      iVar2 = getReg();
      y->r = iVar2;
      put(0x10,iVar2,0,1);
      put(0x28,0,0,2);
      fixLink(y->a);
      put(0x10,y->r,0,0);
    }
    else {
      load(y);
    }
  }
  if (x->mode != 0x2c6) {
    if (x->mode != 0x2c1) {
      msg = "illegal assignment";
      goto LAB_001077a3;
    }
    if (x->lev == 0) {
      x->a = x->a + RISC_MEMSIZE;
    }
    if (x->hs == 0) {
      iVar2 = y->r;
      c = x->a;
      b = x->r;
      op = 0x24;
      goto LAB_00107755;
    }
    put(0x28,x->hs,0,3);
    put(0x24,y->r,x->r,x->a);
    put(0x28,0,0,2);
  }
  iVar2 = y->r;
  c = x->a;
  b = x->r;
  op = 0x34;
LAB_00107755:
  put(op,iVar2,b,c);
  regs[x->hs] = 0;
  regs[y->r] = 0;
  regs[x->r] = 0;
  return;
}

Assistant:

procedure 
void store(struct item *x, struct item *y) {
	variable struct typeDesc *typeX; variable struct typeDesc *typeY;variable int r;
	variable int op;typeX = NULL; typeY = NULL; op = 0; 

	/* get the type of both items */
	typeX = getType(x->typeIndex); typeY = getType(y->typeIndex);

	/* type checking */
	if (((typeX->form == FORM_INT) || (typeX->form == FORM_CHAR) || 
		(typeX->form == FORM_REF) || (typeX->form == FORM_BOOL)) && (typeX->form == typeY->form)) {
		
		/* handle conditon on right hand side of assignment */
		if (y->mode == CLASS_COND) {
			op = selectOpNegated(y->c);
			put(op, y->r, 0, y->a); 
			regs[y->r] = 0; 
			y->a = pc - 1;
			fixLink(y->b); 
			r = getReg();
			y->r = r; 
			put(RISC_ADDI,y->r,0,1); 
			put(RISC_BEQ,0,0,2);
			fixLink(y->a); 
			put(RISC_ADDI,y->r,0,0);
		} elsif ((y->mode != CLASS_REG) && (y->mode != CLASS_PROC)) {
			load(y);
		}
		if (x->mode == CLASS_VAR) {
			if (x->lev == 0) {
				x->a = RISC_MEMSIZE + x->a;
			}
			if (x->hs != 0) { 
				put(RISC_BEQ,x->hs,0,3); 
				put(RISC_STW,y->r,x->r,x->a); 
				put(RISC_BEQ,0,0,2);
				put(RISC_HSTW,y->r,x->r,x->a); 
			} else {
				put(RISC_STW,y->r,x->r,x->a); 
			}
		} elsif (x->mode == CLASS_IND) { 
			put(RISC_HSTW,y->r,x->r,x->a);
		} else {
			mark("illegal assignment");
			exit(-1);
		}
		regs[x->hs] = 0;
		regs[y->r]  = 0;
		regs[x->r]  = 0;
	} else {
		mark("incompatible assignment");
		exit(-1);
	}	
}